

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMessagePattern::BacktraceParams>::reallocateAndGrow
          (QArrayDataPointer<QMessagePattern::BacktraceParams> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QMessagePattern::BacktraceParams> *old)

{
  long lVar1;
  bool bVar2;
  BacktraceParams *pBVar3;
  QGenericArrayOps<QMessagePattern::BacktraceParams> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QMessagePattern::BacktraceParams> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QMessagePattern::BacktraceParams> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  BacktraceParams *in_stack_ffffffffffffff70;
  BacktraceParams *in_stack_ffffffffffffff78;
  QGenericArrayOps<QMessagePattern::BacktraceParams> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QMessagePattern::BacktraceParams> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QMessagePattern::BacktraceParams> *)
                           in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QMessagePattern::BacktraceParams> *)&DAT_aaaaaaaaaaaaaaaa,
                 (qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pBVar3 = data((QArrayDataPointer<QMessagePattern::BacktraceParams> *)
                      &stack0xffffffffffffffe0), pBVar3 == (BacktraceParams *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_00251ada;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QMessagePattern::BacktraceParams> *)
                          in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QMessagePattern::BacktraceParams> *)
                  operator->((QArrayDataPointer<QMessagePattern::BacktraceParams> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QMessagePattern::BacktraceParams> *)0x2519e7);
        begin((QArrayDataPointer<QMessagePattern::BacktraceParams> *)0x2519f6);
        QtPrivate::QGenericArrayOps<QMessagePattern::BacktraceParams>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (BacktraceParams *)
             operator->((QArrayDataPointer<QMessagePattern::BacktraceParams> *)
                        &stack0xffffffffffffffe0);
        pBVar3 = begin((QArrayDataPointer<QMessagePattern::BacktraceParams> *)0x251a31);
        begin((QArrayDataPointer<QMessagePattern::BacktraceParams> *)0x251a40);
        QtPrivate::QGenericArrayOps<QMessagePattern::BacktraceParams>::moveAppend
                  (in_stack_ffffffffffffff80,pBVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<QMessagePattern::BacktraceParams> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<QMessagePattern::BacktraceParams> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QMessagePattern::BacktraceParams> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<QMessagePattern::BacktraceParams> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<QMessagePattern::BacktraceParams> *)
                       in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity
              ((QArrayDataPointer<QMessagePattern::BacktraceParams> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<QMessagePattern::BacktraceParams> *)in_stack_ffffffffffffff78)
    ;
    QtPrivate::QMovableArrayOps<QMessagePattern::BacktraceParams>::reallocate
              ((QMovableArrayOps<QMessagePattern::BacktraceParams> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00251ada:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }